

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O3

void __thiscall test_app::test_keywords(test_app *this)

{
  to_string_type *pp_Var1;
  int iVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  ostringstream oss;
  ostringstream ss;
  streamable local_350;
  streamable local_330 [11];
  streamable local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::url_mapper::map(poVar3,(char *)local_198);
  value((string *)local_330,(ostringstream *)local_198);
  iVar2 = std::__cxx11::string::compare((char *)local_330);
  pp_Var1 = &local_330[0].to_string_;
  if ((to_string_type *)local_330[0].ptr_ != pp_Var1) {
    operator_delete(local_330[0].ptr_);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x23c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," value(ss)==\"xx/foobar/bee/en\"",0x1e);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_350);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(local_330,"ru");
  cppcms::url_mapper::map(poVar3,(char *)local_198,(streamable *)"/foobar/bee/bylang;lang");
  cppcms::filters::streamable::~streamable(local_330);
  value((string *)local_330,(ostringstream *)local_198);
  iVar2 = std::__cxx11::string::compare((char *)local_330);
  if ((to_string_type *)local_330[0].ptr_ != pp_Var1) {
    operator_delete(local_330[0].ptr_);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x23e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," value(ss)==\"xx/foobar/bee/ru\"",0x1e);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_350);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(local_330,"ru");
  cppcms::url_mapper::map(poVar3,(char *)local_198,(streamable *)"/foobar/bee/byloc;lang");
  cppcms::filters::streamable::~streamable(local_330);
  value((string *)local_330,(ostringstream *)local_198);
  iVar2 = std::__cxx11::string::compare((char *)local_330);
  if ((to_string_type *)local_330[0].ptr_ != pp_Var1) {
    operator_delete(local_330[0].ptr_);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x240);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," value(ss)==\"xx/foobar/bee/ru_US\"",0x21);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_350);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(local_330,"ru");
  cppcms::filters::streamable::streamable(&local_350,"RU");
  cppcms::url_mapper::map
            (poVar3,(char *)local_198,(streamable *)"/foobar/bee/byloc;lang,terr",local_330);
  cppcms::filters::streamable::~streamable(&local_350);
  cppcms::filters::streamable::~streamable(local_330);
  value((string *)local_330,(ostringstream *)local_198);
  iVar2 = std::__cxx11::string::compare((char *)local_330);
  if ((to_string_type *)local_330[0].ptr_ != pp_Var1) {
    operator_delete(local_330[0].ptr_);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x242);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," value(ss)==\"xx/foobar/bee/ru_RU\"",0x21);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_350);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable(local_330,"RU");
  cppcms::url_mapper::map(poVar3,(char *)local_198,(streamable *)"/foobar/bee/byloc;terr");
  cppcms::filters::streamable::~streamable(local_330);
  value((string *)local_330,(ostringstream *)local_198);
  iVar2 = std::__cxx11::string::compare((char *)local_330);
  if ((to_string_type *)local_330[0].ptr_ != pp_Var1) {
    operator_delete(local_330[0].ptr_);
  }
  if (iVar2 == 0) {
    poVar3 = (ostream *)cppcms::application::mapper();
    cppcms::filters::streamable::streamable(local_330,"UA");
    cppcms::filters::streamable::streamable(&local_350,"ru");
    cppcms::url_mapper::map
              (poVar3,(char *)local_198,(streamable *)"/foobar/bee/byloc;terr,lang",local_330);
    cppcms::filters::streamable::~streamable(&local_350);
    cppcms::filters::streamable::~streamable(local_330);
    value((string *)local_330,(ostringstream *)local_198);
    iVar2 = std::__cxx11::string::compare((char *)local_330);
    if ((to_string_type *)local_330[0].ptr_ != pp_Var1) {
      operator_delete(local_330[0].ptr_);
    }
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x246);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," value(ss)==\"xx/foobar/bee/ru_UA\"",0x21);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_350);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar3 = (ostream *)cppcms::application::mapper();
    cppcms::filters::streamable::streamable(local_330,"ru");
    cppcms::filters::streamable::streamable(&local_350,"foo");
    cppcms::url_mapper::map
              (poVar3,(char *)local_198,(streamable *)"/foobar/bee/byloc;lang",local_330);
    cppcms::filters::streamable::~streamable(&local_350);
    cppcms::filters::streamable::~streamable(local_330);
    value((string *)local_330,(ostringstream *)local_198);
    iVar2 = std::__cxx11::string::compare((char *)local_330);
    if ((to_string_type *)local_330[0].ptr_ != pp_Var1) {
      operator_delete(local_330[0].ptr_);
    }
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x248);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," value(ss)==\"xx/foobar/bee/ru_US/foo\"",0x25);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_350);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar3 = (ostream *)cppcms::application::mapper();
    cppcms::filters::streamable::streamable(local_330,"ru");
    cppcms::filters::streamable::streamable(&local_350,"RU");
    cppcms::filters::streamable::streamable(&local_1b8,"foo");
    cppcms::url_mapper::map
              (poVar3,(char *)local_198,(streamable *)"/foobar/bee/byloc;lang,terr",local_330,
               &local_350);
    cppcms::filters::streamable::~streamable(&local_1b8);
    cppcms::filters::streamable::~streamable(&local_350);
    cppcms::filters::streamable::~streamable(local_330);
    value((string *)local_330,(ostringstream *)local_198);
    iVar2 = std::__cxx11::string::compare((char *)local_330);
    if ((to_string_type *)local_330[0].ptr_ != pp_Var1) {
      operator_delete(local_330[0].ptr_);
    }
    if (iVar2 == 0) {
      poVar3 = (ostream *)cppcms::application::mapper();
      cppcms::filters::streamable::streamable(local_330,"RU");
      cppcms::filters::streamable::streamable(&local_350,"foo");
      cppcms::url_mapper::map
                (poVar3,(char *)local_198,(streamable *)"/foobar/bee/byloc;terr",local_330);
      cppcms::filters::streamable::~streamable(&local_350);
      cppcms::filters::streamable::~streamable(local_330);
      value((string *)local_330,(ostringstream *)local_198);
      iVar2 = std::__cxx11::string::compare((char *)local_330);
      if ((to_string_type *)local_330[0].ptr_ != pp_Var1) {
        operator_delete(local_330[0].ptr_);
      }
      if (iVar2 == 0) {
        poVar3 = (ostream *)cppcms::application::mapper();
        cppcms::filters::streamable::streamable(local_330,"UA");
        cppcms::filters::streamable::streamable(&local_350,"ru");
        cppcms::filters::streamable::streamable(&local_1b8,"foo");
        cppcms::url_mapper::map
                  (poVar3,(char *)local_198,(streamable *)"/foobar/bee/byloc;terr,lang",local_330,
                   &local_350);
        cppcms::filters::streamable::~streamable(&local_1b8);
        cppcms::filters::streamable::~streamable(&local_350);
        cppcms::filters::streamable::~streamable(local_330);
        value((string *)local_330,(ostringstream *)local_198);
        iVar2 = std::__cxx11::string::compare((char *)local_330);
        if ((to_string_type *)local_330[0].ptr_ != pp_Var1) {
          operator_delete(local_330[0].ptr_);
        }
        if (iVar2 == 0) {
          std::__cxx11::ostringstream::~ostringstream(local_198);
          std::ios_base::~ios_base(local_128);
          return;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_330,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x24e);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," value(ss)==\"xx/foobar/bee/ru_UA/foo\"",0x25);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)&local_350);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x24c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," value(ss)==\"xx/foobar/bee/en_RU/foo\"",0x25);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_350);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x24a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," value(ss)==\"xx/foobar/bee/ru_RU/foo\"",0x25);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_350);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x244);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3," value(ss)==\"xx/foobar/bee/en_RU\"",0x21);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,(string *)&local_350);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_keywords()
	{
		std::ostringstream ss;
		mapper().map(ss,"/foobar/bee/bylang");
		TEST(value(ss)=="xx/foobar/bee/en");
		mapper().map(ss,"/foobar/bee/bylang;lang","ru");
		TEST(value(ss)=="xx/foobar/bee/ru");
		mapper().map(ss,"/foobar/bee/byloc;lang","ru");
		TEST(value(ss)=="xx/foobar/bee/ru_US");
		mapper().map(ss,"/foobar/bee/byloc;lang,terr","ru","RU");
		TEST(value(ss)=="xx/foobar/bee/ru_RU");
		mapper().map(ss,"/foobar/bee/byloc;terr","RU");
		TEST(value(ss)=="xx/foobar/bee/en_RU");
		mapper().map(ss,"/foobar/bee/byloc;terr,lang","UA","ru");
		TEST(value(ss)=="xx/foobar/bee/ru_UA");
		mapper().map(ss,"/foobar/bee/byloc;lang","ru","foo");
		TEST(value(ss)=="xx/foobar/bee/ru_US/foo");
		mapper().map(ss,"/foobar/bee/byloc;lang,terr","ru","RU","foo");
		TEST(value(ss)=="xx/foobar/bee/ru_RU/foo");
		mapper().map(ss,"/foobar/bee/byloc;terr","RU","foo");
		TEST(value(ss)=="xx/foobar/bee/en_RU/foo");
		mapper().map(ss,"/foobar/bee/byloc;terr,lang","UA","ru","foo");
		TEST(value(ss)=="xx/foobar/bee/ru_UA/foo");
	}